

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O1

size_t secp256k1_context_preallocated_size(uint flags)

{
  ulong uVar1;
  ulong uVar2;
  uint in_register_0000003c;
  int *piVar3;
  unsigned_long _zzq_result;
  unsigned_long _zzq_args [6];
  
  piVar3 = (int *)CONCAT44(in_register_0000003c,flags);
  if ((char)flags == '\x01') {
    uVar1 = (ulong)((long)piVar3 << 3) >> 0x33;
    uVar2 = (((long)piVar3 << 3 | (ulong)(in_register_0000003c >> 0x1d)) << 0xd | uVar1) >> 3;
    uVar1 = (uVar1 << 0x3d | uVar2) >> 0xd;
    piVar3 = (int *)(uVar2 << 0x33 | uVar1);
    if (((uint)uVar1 >> 10 & 1) == 0) {
      return 0xd0;
    }
  }
  else {
    secp256k1_context_preallocated_size_cold_1();
  }
  secp256k1_context_preallocated_size_cold_2();
  if (*piVar3 != 0) {
    return 0xd0;
  }
  secp256k1_context_preallocated_clone_size_cold_1();
  return 0;
}

Assistant:

size_t secp256k1_context_preallocated_size(unsigned int flags) {
    size_t ret = sizeof(secp256k1_context);
    /* A return value of 0 is reserved as an indicator for errors when we call this function internally. */
    VERIFY_CHECK(ret != 0);

    if (EXPECT((flags & SECP256K1_FLAGS_TYPE_MASK) != SECP256K1_FLAGS_TYPE_CONTEXT, 0)) {
            secp256k1_callback_call(&default_illegal_callback,
                                    "Invalid flags");
            return 0;
    }

    if (EXPECT(!SECP256K1_CHECKMEM_RUNNING() && (flags & SECP256K1_FLAGS_BIT_CONTEXT_DECLASSIFY), 0)) {
            secp256k1_callback_call(&default_illegal_callback,
                                    "Declassify flag requires running with memory checking");
            return 0;
    }

    return ret;
}